

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

SharedExNdPtr __thiscall front::syntax::SyntaxAnalyze::gm_l_val(SyntaxAnalyze *this,ValueMode mode)

{
  irGenerator *piVar1;
  char cVar2;
  NodeType NVar3;
  undefined8 *puVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  string name_00;
  string name_01;
  string name_02;
  string name_03;
  string name_04;
  string name_05;
  string name_06;
  string name_07;
  string name_08;
  string name_09;
  string name_10;
  undefined4 uVar9;
  SharedExNdPtr *pSVar10;
  element_type *peVar11;
  bool bVar12;
  int iVar13;
  ExpressNode *pEVar14;
  mapped_type *pmVar15;
  reference pvVar16;
  mapped_type *pmVar17;
  int in_EDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  string *psVar18;
  undefined4 in_register_00000034;
  SyntaxAnalyze *this_00;
  string *this_01;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  SharedExNdPtr SVar19;
  undefined8 uStack_648;
  SharedExNdPtr index;
  string valueTmp;
  SharedExNdPtr constValue;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f8;
  SharedExNdPtr addr;
  SharedExNdPtr child;
  SharedSyPtr arr;
  SharedExNdPtr loadValue;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_580;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_570;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_560;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_550;
  __shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2> local_540;
  __shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> local_530;
  string name;
  string local_500 [32];
  string local_4e0;
  string local_4c0 [32];
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400 [32];
  string local_3e0;
  string local_3c0 [32];
  string local_3a0;
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320;
  string local_300 [32];
  string local_2e0;
  string local_2c0 [32];
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a0;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_278;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_200;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  string local_70;
  string local_50;
  
  this_00 = (SyntaxAnalyze *)CONCAT44(in_register_00000034,mode);
  pEVar14 = (ExpressNode *)operator_new(0x48);
  express::ExpressNode::ExpressNode(pEVar14);
  std::__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<front::express::ExpressNode,void>
            ((__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2> *)this,pEVar14);
  name._M_dataplus._M_p = (pointer)&name.field_2;
  name._M_string_length = 0;
  name.field_2._M_local_buf[0] = '\0';
  match_one_word(this_00,IDENFR);
  word::Word::get_self_abi_cxx11_
            ((string *)&constValue,
             (this_00->word_list->
             super__Vector_base<front::word::Word,_std::allocator<front::word::Word>_>)._M_impl.
             super__Vector_impl_data._M_start + this_00->matched_index);
  std::__cxx11::string::operator=((string *)&name,(string *)&constValue);
  std::__cxx11::string::~string((string *)&constValue);
  bVar12 = try_word(this_00,1,LBRACK);
  if (!bVar12) {
    std::__cxx11::string::string(local_360,(string *)&name);
    symbolTable::SymbolTable::find_least_layer_symbol
              ((SymbolTable *)&index,(string *)&this_00->symbolTable);
    std::__cxx11::string::~string(local_360);
    iVar13 = (*(code *)**(undefined8 **)
                         index.
                         super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)();
    if (iVar13 == 0) {
      std::static_pointer_cast<front::symbol::IntSymbol,front::symbol::Symbol>
                ((shared_ptr<front::symbol::Symbol> *)&constValue);
      cVar2 = *(char *)&((constValue.
                          super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->_children).
                        super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&constValue.
                  super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      if (cVar2 == '\x01') {
        **(undefined8 **)this = 0x200000000;
        std::static_pointer_cast<front::symbol::IntSymbol,front::symbol::Symbol>
                  ((shared_ptr<front::symbol::Symbol> *)&constValue);
        *(undefined4 *)(*(long *)this + 8) =
             *(undefined4 *)
              ((long)&((constValue.
                        super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->_children).
                      super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 4);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&constValue.
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
      else {
        **(undefined8 **)this = 0x200000001;
        std::__cxx11::string::string
                  (local_380,
                   (string *)
                   &(index.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->_value);
        piVar1 = &this_00->irGenerator;
        name_03._M_string_length = (size_type)this;
        name_03._M_dataplus._M_p = (pointer)uStack_648;
        name_03.field_2._M_allocated_capacity =
             (size_type)
             index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        name_03.field_2._8_8_ =
             index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        irGenerator::irGenerator::getVarName
                  ((string *)&constValue,piVar1,name_03,(uint32_t)local_380);
        std::__cxx11::string::operator=((string *)(*(long *)this + 0x10),(string *)&constValue);
        std::__cxx11::string::~string((string *)&constValue);
        std::__cxx11::string::~string(local_380);
        if (*(uint32_t *)
             ((long)&((index.
                       super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->_name).field_2 + 8) == this_00->_initLayerNum) {
          child.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          child.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          constValue.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)&local_5f8;
          constValue.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_5f8._M_local_buf[0] = '\0';
          irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&valueTmp,piVar1,Ptr);
          std::__cxx11::string::operator=((string *)&constValue,(string *)&valueTmp);
          std::__cxx11::string::~string((string *)&valueTmp);
          pEVar14 = (ExpressNode *)operator_new(0x48);
          express::ExpressNode::ExpressNode(pEVar14);
          std::__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<front::express::ExpressNode,void>
                    ((__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2> *)
                     &valueTmp,pEVar14);
          std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&child.
                      super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)
                     &valueTmp);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&valueTmp._M_string_length);
          (child.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->_type = VAR;
          (child.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->_operation = PTR;
          std::__cxx11::string::_M_assign
                    ((string *)
                     &(child.
                       super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->_name);
          peVar11 = child.
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_570,
                     (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)this);
          express::ExpressNode::addChild(peVar11,(SharedExNdPtr *)&local_570);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_570._M_refcount);
          std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
          _Variant_storage<1ul,std::__cxx11::string&>
                    ((_Variant_storage<false,int,std::__cxx11::string> *)&local_228,&constValue);
          std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
          _Variant_storage<1ul,std::__cxx11::string&>
                    ((_Variant_storage<false,int,std::__cxx11::string> *)&local_250,
                     *(long *)this + 0x10);
          irGenerator::irGenerator::ir_ref(piVar1,(LeftVal *)&local_228,(LeftVal *)&local_250,false)
          ;
          std::__detail::__variant::
          _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~_Variant_storage(&local_250);
          std::__detail::__variant::
          _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~_Variant_storage(&local_228);
          if (in_EDX == 1) {
            std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)this
                       ,&child.
                         super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                      );
          }
          else {
            addr.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (element_type *)0x0;
            addr.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            valueTmp._M_dataplus._M_p = (pointer)&valueTmp.field_2;
            valueTmp._M_string_length = 0;
            valueTmp.field_2._M_local_buf[0] = '\0';
            irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_((string *)&arr,piVar1,Int);
            std::__cxx11::string::operator=((string *)&valueTmp,(string *)&arr);
            std::__cxx11::string::~string((string *)&arr);
            pEVar14 = (ExpressNode *)operator_new(0x48);
            express::ExpressNode::ExpressNode(pEVar14);
            std::__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<front::express::ExpressNode,void>
                      ((__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2> *)&arr,
                       pEVar14);
            std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (&addr.
                        super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
                       (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)&arr
                      );
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&arr.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
            (addr.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->_type = VAR;
            (addr.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            )->_operation = LOAD;
            std::__cxx11::string::_M_assign
                      ((string *)
                       &(addr.
                         super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_name);
            peVar11 = addr.
                      super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_580,
                       &child.
                        super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>)
            ;
            express::ExpressNode::addChild(peVar11,(SharedExNdPtr *)&local_580);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_580._M_refcount)
            ;
            std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
            _Variant_storage<1ul,std::__cxx11::string&>
                      ((_Variant_storage<false,int,std::__cxx11::string> *)&local_278,
                       &(addr.
                         super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_name);
            std::__detail::__variant::_Variant_storage<false,int,int,std::__cxx11::string>::
            _Variant_storage<2ul,std::__cxx11::string&>
                      ((_Variant_storage<false,int,int,std::__cxx11::string> *)&local_2a0,
                       &(child.
                         super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_name);
            irGenerator::irGenerator::ir_load(piVar1,(LeftVal *)&local_278,(RightVal *)&local_2a0);
            std::__detail::__variant::
            _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~_Variant_storage(&local_2a0);
            std::__detail::__variant::
            _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~_Variant_storage(&local_278);
            std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)this
                       ,&addr.
                         super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                      );
            std::__cxx11::string::~string((string *)&valueTmp);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&addr.
                        super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          }
          std::__cxx11::string::~string((string *)&constValue);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&child.
                      super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        if (in_EDX == 1) {
          std::__cxx11::string::string
                    (local_3c0,
                     (string *)
                     &(index.
                       super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->_value);
          name_06._M_string_length = (size_type)this;
          name_06._M_dataplus._M_p = (pointer)uStack_648;
          name_06.field_2._M_allocated_capacity =
               (size_type)
               index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          name_06.field_2._8_8_ =
               index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          irGenerator::irGenerator::getVarName(&local_3a0,piVar1,name_06,(uint32_t)local_3c0);
          bVar12 = optimization::bmir_variable_table::BmirVariableTable::hasVarSingle
                             (&this_00->bmirVariableTable,&local_3a0);
          std::__cxx11::string::~string((string *)&local_3a0);
          std::__cxx11::string::~string(local_3c0);
          if (bVar12) {
            std::__cxx11::string::string
                      (local_400,
                       (string *)
                       &(index.
                         super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_value);
            name_07._M_string_length = (size_type)this;
            name_07._M_dataplus._M_p = (pointer)uStack_648;
            name_07.field_2._M_allocated_capacity =
                 (size_type)
                 index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
            name_07.field_2._8_8_ =
                 index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            irGenerator::irGenerator::getVarName(&local_3e0,piVar1,name_07,(uint32_t)local_400);
            pmVar17 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>_>_>
                      ::at(&(this_00->bmirVariableTable).name2VarSingle,&local_3e0);
            ((pmVar17->
             super___shared_ptr<front::optimization::bmir_variable_table::VarSingle,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr)->changed = true;
            std::__cxx11::string::~string((string *)&local_3e0);
            this_01 = local_400;
            goto LAB_00184c5f;
          }
        }
      }
    }
    else {
      iVar13 = (*(code *)**(undefined8 **)
                           index.
                           super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)();
      if (iVar13 == 2) {
        constValue.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&local_5f8;
        constValue.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_5f8._M_local_buf[0] = '\0';
        piVar1 = &this_00->irGenerator;
        irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&valueTmp,piVar1,Ptr);
        std::__cxx11::string::operator=((string *)&constValue,(string *)&valueTmp);
        std::__cxx11::string::~string((string *)&valueTmp);
        puVar4 = *(undefined8 **)this;
        *puVar4 = 0x600000001;
        std::__cxx11::string::_M_assign((string *)(puVar4 + 2));
        std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
                  ((shared_ptr<front::symbol::Symbol> *)&valueTmp);
        cVar2 = valueTmp._M_dataplus._M_p[0x40];
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&valueTmp._M_string_length);
        if (cVar2 == '\x01') {
          std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
          _Variant_storage<1ul,std::__cxx11::string&>
                    ((_Variant_storage<false,int,std::__cxx11::string> *)&local_98,&constValue);
          std::__cxx11::string::string
                    ((string *)&local_420,
                     (string *)
                     &(index.
                       super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->_value);
          irGenerator::irGenerator::getConstName
                    (&valueTmp,piVar1,&local_420,
                     *(int *)((long)&((index.
                                       super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->_name).field_2 + 0xc));
          std::variant<int,std::__cxx11::string>::
          variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
                    ((variant<int,std::__cxx11::string> *)&local_c0,&valueTmp);
          this_02 = &local_98;
          irGenerator::irGenerator::ir_ref(piVar1,(LeftVal *)this_02,(LeftVal *)&local_c0,false);
          std::__detail::__variant::
          _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~_Variant_storage(&local_c0);
          std::__cxx11::string::~string((string *)&valueTmp);
          psVar18 = &local_420;
        }
        else {
          std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
                    ((shared_ptr<front::symbol::Symbol> *)&valueTmp);
          cVar2 = valueTmp._M_dataplus._M_p[0x41];
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&valueTmp._M_string_length);
          if (cVar2 == '\x01') {
            std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
            _Variant_storage<1ul,std::__cxx11::string&>
                      ((_Variant_storage<false,int,std::__cxx11::string> *)&local_e8,&constValue);
            std::__cxx11::string::string
                      ((string *)&local_440,
                       (string *)
                       &(index.
                         super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_value);
            name_04._M_string_length = (size_type)this;
            name_04._M_dataplus._M_p = (pointer)uStack_648;
            name_04.field_2._M_allocated_capacity =
                 (size_type)
                 index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
            name_04.field_2._8_8_ =
                 index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            irGenerator::irGenerator::getVarName(&valueTmp,piVar1,name_04,(uint32_t)&local_440);
            std::variant<int,int,std::__cxx11::string>::
            variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
                      ((variant<int,int,std::__cxx11::string> *)&local_110,&valueTmp);
            this_02 = &local_e8;
            irGenerator::irGenerator::ir_assign(piVar1,(LeftVal *)this_02,(RightVal *)&local_110);
            std::__detail::__variant::
            _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~_Variant_storage(&local_110);
            std::__cxx11::string::~string((string *)&valueTmp);
            psVar18 = &local_440;
          }
          else {
            if (*(uint32_t *)
                 ((long)&((index.
                           super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->_name).field_2 + 8) != this_00->_initLayerNum) {
              std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
                        ((shared_ptr<front::symbol::Symbol> *)&valueTmp);
              cVar2 = valueTmp._M_dataplus._M_p[0x40];
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&valueTmp._M_string_length);
              if (cVar2 == '\0') {
                std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
                _Variant_storage<1ul,std::__cxx11::string&>
                          ((_Variant_storage<false,int,std::__cxx11::string> *)&local_138,
                           &constValue);
                std::__cxx11::string::string
                          ((string *)&local_460,
                           (string *)
                           &(index.
                             super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->_value);
                name_08._M_string_length = (size_type)this;
                name_08._M_dataplus._M_p = (pointer)uStack_648;
                name_08.field_2._M_allocated_capacity =
                     (size_type)
                     index.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
                name_08.field_2._8_8_ =
                     index.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
                irGenerator::irGenerator::getVarName(&valueTmp,piVar1,name_08,(uint32_t)&local_460);
                std::variant<int,int,std::__cxx11::string>::
                variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
                          ((variant<int,int,std::__cxx11::string> *)&local_160,&valueTmp);
                this_02 = &local_138;
                irGenerator::irGenerator::ir_assign
                          (piVar1,(LeftVal *)this_02,(RightVal *)&local_160);
                std::__detail::__variant::
                _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~_Variant_storage(&local_160);
                std::__cxx11::string::~string((string *)&valueTmp);
                psVar18 = &local_460;
                goto LAB_00184b7a;
              }
            }
            std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
            _Variant_storage<1ul,std::__cxx11::string&>
                      ((_Variant_storage<false,int,std::__cxx11::string> *)&local_188,&constValue);
            std::__cxx11::string::string
                      ((string *)&local_480,
                       (string *)
                       &(index.
                         super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_value);
            name_05._M_string_length = (size_type)this;
            name_05._M_dataplus._M_p = (pointer)uStack_648;
            name_05.field_2._M_allocated_capacity =
                 (size_type)
                 index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
            name_05.field_2._8_8_ =
                 index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            irGenerator::irGenerator::getVarName(&valueTmp,piVar1,name_05,(uint32_t)&local_480);
            std::variant<int,std::__cxx11::string>::
            variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
                      ((variant<int,std::__cxx11::string> *)&local_1b0,&valueTmp);
            this_02 = &local_188;
            irGenerator::irGenerator::ir_ref(piVar1,(LeftVal *)this_02,(LeftVal *)&local_1b0,false);
            std::__detail::__variant::
            _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~_Variant_storage(&local_1b0);
            std::__cxx11::string::~string((string *)&valueTmp);
            psVar18 = &local_480;
          }
        }
LAB_00184b7a:
        std::__cxx11::string::~string((string *)psVar18);
        std::__detail::__variant::
        _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Variant_storage(this_02);
        std::__cxx11::string::string
                  (local_4c0,
                   (string *)
                   &(index.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->_value);
        name_09._M_string_length = (size_type)this;
        name_09._M_dataplus._M_p = (pointer)uStack_648;
        name_09.field_2._M_allocated_capacity =
             (size_type)
             index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        name_09.field_2._8_8_ =
             index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        irGenerator::irGenerator::getVarName(&local_4a0,piVar1,name_09,(uint32_t)local_4c0);
        bVar12 = optimization::bmir_variable_table::BmirVariableTable::hasNameKey
                           (&this_00->bmirVariableTable,&local_4a0);
        std::__cxx11::string::~string((string *)&local_4a0);
        std::__cxx11::string::~string(local_4c0);
        if (bVar12) {
          std::__cxx11::string::string
                    (local_500,
                     (string *)
                     &(index.
                       super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->_value);
          name_10._M_string_length = (size_type)this;
          name_10._M_dataplus._M_p = (pointer)uStack_648;
          name_10.field_2._M_allocated_capacity =
               (size_type)
               index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          name_10.field_2._8_8_ =
               index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
          irGenerator::irGenerator::getVarName(&local_4e0,piVar1,name_10,(uint32_t)local_500);
          pmVar15 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>_>
                    ::at(&(this_00->bmirVariableTable).name2VarArray,&local_4e0);
          ((pmVar15->
           super___shared_ptr<front::optimization::bmir_variable_table::VarArray,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr)->changed = true;
          std::__cxx11::string::~string((string *)&local_4e0);
          std::__cxx11::string::~string(local_500);
        }
        this_01 = (string *)&constValue;
LAB_00184c5f:
        std::__cxx11::string::~string(this_01);
      }
    }
    pSVar10 = &index;
    goto LAB_00184c69;
  }
  std::__cxx11::string::string(local_2c0,(string *)&name);
  symbolTable::SymbolTable::find_least_layer_symbol
            ((SymbolTable *)&arr,(string *)&this_00->symbolTable);
  std::__cxx11::string::~string(local_2c0);
  index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  child.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  child.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  addr.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  addr.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  **(undefined4 **)this = 1;
  std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
            ((shared_ptr<front::symbol::Symbol> *)&constValue);
  if (*(char *)((long)&((constValue.
                         super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_children).
                       super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) == '\0') {
    if ((arr.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        _layerNum == this_00->_initLayerNum) {
      uVar9 = 3;
      goto LAB_00183eb5;
    }
    std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
              ((shared_ptr<front::symbol::Symbol> *)&valueTmp);
    *(uint *)(*(long *)this + 4) = ((byte)valueTmp._M_dataplus._M_p[0x40] ^ 1) * 3 + 3;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&valueTmp._M_string_length);
  }
  else {
    uVar9 = 6;
LAB_00183eb5:
    *(undefined4 *)(*(long *)this + 4) = uVar9;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&constValue.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
            ((shared_ptr<front::symbol::Symbol> *)&valueTmp);
  if (valueTmp._M_dataplus._M_p[0x40] == '\x01') {
    psVar18 = &local_50;
    std::__cxx11::string::string
              ((string *)psVar18,
               (string *)
               &(arr.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _name);
    irGenerator::irGenerator::getConstName
              ((string *)&constValue,&this_00->irGenerator,psVar18,
               (arr.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               id);
  }
  else {
    psVar18 = &local_70;
    std::__cxx11::string::string
              ((string *)psVar18,
               (string *)
               &(arr.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _name);
    name_00._M_string_length = (size_type)this;
    name_00._M_dataplus._M_p = (pointer)uStack_648;
    name_00.field_2._M_allocated_capacity =
         (size_type)
         index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    name_00.field_2._8_8_ =
         index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    irGenerator::irGenerator::getVarName
              ((string *)&constValue,&this_00->irGenerator,name_00,(uint32_t)psVar18);
  }
  std::__cxx11::string::operator=((string *)(*(long *)this + 0x10),(string *)&constValue);
  std::__cxx11::string::~string((string *)&constValue);
  std::__cxx11::string::~string((string *)psVar18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&valueTmp._M_string_length);
  while( true ) {
    bVar12 = try_word(this_00,1,LBRACK);
    if (!bVar12) break;
    match_one_word(this_00,LBRACK);
    gm_exp((SyntaxAnalyze *)&constValue);
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&child.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)&constValue)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&constValue.
                super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    pEVar14 = *(ExpressNode **)this;
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_530,
               &child.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
    express::ExpressNode::addChild(pEVar14,(SharedExNdPtr *)&local_530);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_530._M_refcount);
    match_one_word(this_00,RBRACK);
  }
  std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_540,&arr.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_550,
             (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)this);
  computeIndex((SyntaxAnalyze *)&constValue,(SharedSyPtr *)this_00,(SharedExNdPtr *)&local_540);
  std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&addr.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
             &constValue.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&constValue.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_550._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_540._M_refcount);
  if (in_EDX == 1) {
    std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)this,
               &addr.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
    std::__cxx11::string::string
              (local_300,
               (string *)
               &(arr.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _name);
    name_01._M_string_length = (size_type)this;
    name_01._M_dataplus._M_p = (pointer)uStack_648;
    name_01.field_2._M_allocated_capacity =
         (size_type)
         index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    name_01.field_2._8_8_ =
         index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    irGenerator::irGenerator::getVarName
              (&local_2e0,&this_00->irGenerator,name_01,(uint32_t)local_300);
    bVar12 = optimization::bmir_variable_table::BmirVariableTable::hasNameKey
                       (&this_00->bmirVariableTable,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string(local_300);
    if (bVar12) {
      std::__cxx11::string::string
                (local_340,
                 (string *)
                 &(arr.super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->_name);
      name_02._M_string_length = (size_type)this;
      name_02._M_dataplus._M_p = (pointer)uStack_648;
      name_02.field_2._M_allocated_capacity =
           (size_type)
           index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      name_02.field_2._8_8_ =
           index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      irGenerator::irGenerator::getVarName
                (&local_320,&this_00->irGenerator,name_02,(uint32_t)local_340);
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>_>
                ::at(&(this_00->bmirVariableTable).name2VarArray,&local_320);
      ((pmVar15->
       super___shared_ptr<front::optimization::bmir_variable_table::VarArray,_(__gnu_cxx::_Lock_policy)2>
       )._M_ptr)->changed = true;
      std::__cxx11::string::~string((string *)&local_320);
      std::__cxx11::string::~string(local_340);
    }
  }
  else {
    lVar5 = *(long *)(*(long *)this + 0x38);
    lVar6 = *(long *)(*(long *)this + 0x30);
    std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
              ((shared_ptr<front::symbol::Symbol> *)&constValue);
    lVar7 = *(long *)&constValue.
                      super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr[1]._value;
    lVar8 = *(long *)(constValue.
                      super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 1);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&constValue.
                super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if ((ulong)(lVar5 - lVar6) < (ulong)(lVar7 - lVar8)) {
      std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)this,
                 &addr.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
    }
    else {
      std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
                ((shared_ptr<front::symbol::Symbol> *)&constValue);
      if (*(char *)&((constValue.
                      super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->_children).
                    super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage == '\x01') {
        NVar3 = (((addr.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->_children).
                 super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->_type;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&constValue.
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        if (NVar3 != CNS) goto LAB_00184644;
        constValue.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        constValue.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        pEVar14 = (ExpressNode *)operator_new(0x48);
        express::ExpressNode::ExpressNode(pEVar14);
        std::__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<front::express::ExpressNode,void>
                  ((__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2> *)&valueTmp
                   ,pEVar14);
        std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&constValue.
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)
                   &valueTmp);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&valueTmp._M_string_length);
        (constValue.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_type = CNS;
        (constValue.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_operation = NUMBER;
        std::static_pointer_cast<front::symbol::ArraySymbol,front::symbol::Symbol>
                  ((shared_ptr<front::symbol::Symbol> *)&valueTmp);
        pvVar16 = std::
                  vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                  ::at((vector<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                        *)(valueTmp._M_dataplus._M_p + 0x60),
                       (long)*(int *)(*(long *)&(((((addr.
                                                  super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->_children).
                                                  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                                                  super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->_children).
                                                 super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                                super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                                     + 8));
        (constValue.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_value =
             ((pvVar16->super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>)
             ._M_ptr)->_value;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&valueTmp._M_string_length);
        std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)this,
                   &constValue.
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
        pSVar10 = &constValue;
      }
      else {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&constValue.
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
LAB_00184644:
        constValue.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&local_5f8;
        constValue.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        loadValue.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = (element_type *)0x0;
        loadValue.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_5f8._M_local_buf[0] = '\0';
        irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&valueTmp,&this_00->irGenerator,Int)
        ;
        std::__cxx11::string::operator=((string *)&constValue,(string *)&valueTmp);
        std::__cxx11::string::~string((string *)&valueTmp);
        pEVar14 = (ExpressNode *)operator_new(0x48);
        express::ExpressNode::ExpressNode(pEVar14);
        std::__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<front::express::ExpressNode,void>
                  ((__shared_ptr<front::express::ExpressNode,(__gnu_cxx::_Lock_policy)2> *)&valueTmp
                   ,pEVar14);
        std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&loadValue.
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)
                   &valueTmp);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&valueTmp._M_string_length);
        (loadValue.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_type = VAR;
        (loadValue.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_operation = LOAD;
        std::__cxx11::string::_M_assign
                  ((string *)
                   &(loadValue.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->_name);
        peVar11 = loadValue.
                  super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_560,
                   &addr.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>
                  );
        express::ExpressNode::addChild(peVar11,(SharedExNdPtr *)&local_560);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_560._M_refcount);
        std::__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2> *)this,
                   &loadValue.
                    super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>);
        std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
        _Variant_storage<1ul,std::__cxx11::string&>
                  ((_Variant_storage<false,int,std::__cxx11::string> *)&local_1d8,&constValue);
        std::__detail::__variant::_Variant_storage<false,int,int,std::__cxx11::string>::
        _Variant_storage<2ul,std::__cxx11::string&>
                  ((_Variant_storage<false,int,int,std::__cxx11::string> *)&local_200,
                   &(addr.
                     super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->_name);
        irGenerator::irGenerator::ir_load
                  (&this_00->irGenerator,(LeftVal *)&local_1d8,(RightVal *)&local_200);
        std::__detail::__variant::
        _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Variant_storage(&local_200);
        std::__detail::__variant::
        _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~_Variant_storage(&local_1d8);
        std::__cxx11::string::~string((string *)&constValue);
        pSVar10 = &loadValue;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&(pSVar10->
                  super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount);
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&addr.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&child.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&index.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  pSVar10 = (SharedExNdPtr *)&arr;
LAB_00184c69:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(pSVar10->super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>)
              ._M_refcount);
  std::__cxx11::string::~string((string *)&name);
  SVar19.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  SVar19.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (SharedExNdPtr)
         SVar19.super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedExNdPtr SyntaxAnalyze::gm_l_val(ValueMode mode) {
  SharedExNdPtr node(new ExpressNode());
  string name;

  match_one_word(Token::IDENFR);
  name = get_least_matched_word().get_self();

  if (try_word(1, Token::LBRACK)) {
    SharedSyPtr arr = symbolTable.find_least_layer_symbol(name);
    SharedExNdPtr index;
    SharedExNdPtr child;
    SharedExNdPtr addr;
    node->_type = NodeType::VAR;
    node->_operation =
        (std::static_pointer_cast<ArraySymbol>(arr)->isParam() ||
                 (arr->getLayerNum() != _initLayerNum &&
                  !std::static_pointer_cast<ArraySymbol>(arr)->isConst())
             ? OperationType::PTR
             : OperationType::ARR);
    node->_name = (std::static_pointer_cast<ArraySymbol>(arr)->isConst()
                       ? irGenerator.getConstName(arr->getName(), arr->getId())
                       : irGenerator.getVarName(arr->getName(), arr->getId()));
    while (try_word(1, Token::LBRACK)) {
      match_one_word(Token::LBRACK);
      child = gm_exp();
      node->addChild(child);
      match_one_word(Token::RBRACK);
    }

    addr = computeIndex(arr, node);

    if (mode == ValueMode::left ||
        node->_children.size() <
            std::static_pointer_cast<ArraySymbol>(arr)->_dimensions.size()) {
      node = addr;
    } else if (std::static_pointer_cast<ArraySymbol>(arr)->isConst() &&
               addr->_children.back()->_type == NodeType::CNS) {
      SharedExNdPtr constValue;

      constValue = SharedExNdPtr(new ExpressNode());
      constValue->_type = NodeType::CNS;
      constValue->_operation = OperationType::NUMBER;
      constValue->_value =
          std::static_pointer_cast<ArraySymbol>(arr)
              ->_values.at(addr->_children.back()->_children.front()->_value)
              ->_value;
      node = constValue;
    } else {
      SharedExNdPtr loadValue;
      string value;

      value = irGenerator.getNewTmpValueName(TyKind::Int);
      loadValue = SharedExNdPtr(new ExpressNode());
      loadValue->_type = NodeType::VAR;
      loadValue->_operation = OperationType::LOAD;
      loadValue->_name = value;
      loadValue->addChild(addr);
      node = loadValue;

      irGenerator.ir_load(value, addr->_name);
    }

    if (mode == ValueMode::left) {
      if (bmirVariableTable.hasNameKey(
              irGenerator.getVarName(arr->getName(), arr->getId()))) {
        bmirVariableTable
            .getVarArray(irGenerator.getVarName(arr->getName(), arr->getId()))
            ->changed = true;
      }
    }
  } else {
    SharedSyPtr var = symbolTable.find_least_layer_symbol(name);

    if (var->kind() == SymbolKind::INT) {
      if (std::static_pointer_cast<IntSymbol>(var)->isConst()) {
        node->_type = NodeType::CNS;
        node->_operation = OperationType::VAR;
        node->_value = std::static_pointer_cast<IntSymbol>(var)->getValue();
      } else {
        node->_type = NodeType::VAR;
        node->_operation = OperationType::VAR;
        node->_name = irGenerator.getVarName(var->getName(), var->getId());
        if (var->getLayerNum() == _initLayerNum) {
          SharedExNdPtr addr;
          string addrTmp;

          addrTmp = irGenerator.getNewTmpValueName(TyKind::Ptr);
          addr = SharedExNdPtr(new ExpressNode());
          addr->_type = NodeType::VAR;
          addr->_operation = OperationType::PTR;
          addr->_name = addrTmp;
          addr->addChild(node);

          irGenerator.ir_ref(addrTmp, node->_name);

          if (mode == ValueMode::left) {
            node = addr;
          } else {
            SharedExNdPtr value;
            string valueTmp;

            valueTmp = irGenerator.getNewTmpValueName(TyKind::Int);
            value = SharedExNdPtr(new ExpressNode());
            value->_type = NodeType::VAR;
            value->_operation = OperationType::LOAD;
            value->_name = valueTmp;
            value->addChild(addr);

            irGenerator.ir_load(value->_name, addr->_name);
            node = value;
          }
        }

        if (mode == ValueMode::left) {
          if (bmirVariableTable.hasVarSingle(
                  irGenerator.getVarName(var->getName(), var->getId()))) {
            bmirVariableTable
                .getVarSingle(
                    irGenerator.getVarName(var->getName(), var->getId()))
                ->changed = true;
          }
        }
      }
    } else if (var->kind() == SymbolKind::Array) {
      string arrPtr;

      // The existing of arr name alone which must be the param to func
      arrPtr = irGenerator.getNewTmpValueName(TyKind::Ptr);
      node->_type = NodeType::VAR;
      node->_operation = OperationType::PTR;
      node->_name = arrPtr;

      if (std::static_pointer_cast<ArraySymbol>(var)->isConst()) {
        irGenerator.ir_ref(
            arrPtr, irGenerator.getConstName(var->getName(), var->getId()));
      } else if (std::static_pointer_cast<ArraySymbol>(var)->isParam()) {
        irGenerator.ir_assign(
            arrPtr, irGenerator.getVarName(var->getName(), var->getId()));
      } else if (var->getLayerNum() != _initLayerNum &&
                 !std::static_pointer_cast<ArraySymbol>(var)->isConst()) {
        irGenerator.ir_assign(
            arrPtr, irGenerator.getVarName(var->getName(), var->getId()));
      } else {
        irGenerator.ir_ref(
            arrPtr, irGenerator.getVarName(var->getName(), var->getId()));
      }

      if (bmirVariableTable.hasNameKey(
              irGenerator.getVarName(var->getName(), var->getId()))) {
        bmirVariableTable
            .getVarArray(irGenerator.getVarName(var->getName(), var->getId()))
            ->changed = true;
      }
    }
  }

  return node;
}